

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++:179:17)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_mutex_test_c__:179:17)>
             *this)

{
  Lazy<unsigned_int> *pLVar1;
  uint local_2c;
  Initializer local_28;
  Lazy<unsigned_int> *local_20;
  bool *local_18;
  
  pLVar1 = (this->f).lazy;
  if ((pLVar1->once).futex != 3) {
    local_28._vptr_Initializer = (_func_int **)&PTR_run_001b9c28;
    local_20 = pLVar1;
    local_18 = (this->f).initStarted;
    _::Once::runOnce(&pLVar1->once,&local_28);
  }
  if ((*(pLVar1->value).ptr != 0x7b) && (_::Debug::minSeverity < 3)) {
    local_2c = 0x7b;
    pLVar1 = (this->f).lazy;
    if ((pLVar1->once).futex != 3) {
      local_28._vptr_Initializer = (_func_int **)&PTR_run_001b9c58;
      local_20 = pLVar1;
      local_18 = (this->f).initStarted;
      _::Once::runOnce(&pLVar1->once,&local_28);
    }
    _::Debug::log<char_const(&)[141],unsigned_int,unsigned_int&>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/mutex-test.c++"
               ,0xb8,ERROR,
               "\"failed: expected \" \"(123u) == (lazy.get([&](SpaceFor<uint>& space) -> Own<uint> { initStarted = true; delay(); return space.construct(123); }))\", 123u, lazy.get([&](SpaceFor<uint>& space) -> Own<uint> { initStarted = true; delay(); return space.construct(123); })"
               ,(char (*) [141])
                "failed: expected (123u) == (lazy.get([&](SpaceFor<uint>& space) -> Own<uint> { initStarted = true; delay(); return space.construct(123); }))"
               ,&local_2c,(pLVar1->value).ptr);
  }
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }